

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall
httplib::SSLClient::check_host_name(SSLClient *this,char *pattern,size_t pattern_len)

{
  pointer pbVar1;
  size_t __n;
  size_type sVar2;
  int iVar3;
  bool bVar4;
  const_iterator __begin1;
  pointer pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  pointer pbVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pattern_components;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  if (((this->super_ClientImpl).host_._M_string_length == pattern_len) &&
     (iVar3 = std::__cxx11::string::compare((char *)&(this->super_ClientImpl).host_), iVar3 == 0)) {
    bVar4 = true;
  }
  else {
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._8_8_ = 0;
    local_30 = std::
               _Function_handler<void_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/httplib/httplib.h:7847:13)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/httplib/httplib.h:7847:13)>
               ::_M_manager;
    local_48._M_unused._M_object = &local_68;
    detail::split(pattern,pattern + pattern_len,'.',
                  (function<void_(const_char_*,_const_char_*)> *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    pbVar5 = (this->host_components_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->host_components_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((long)pbVar1 - (long)pbVar5 ==
        (long)local_68.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_68.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
      bVar4 = true;
      pbVar6 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1) {
        __n = pbVar6->_M_string_length;
        if ((((__n != pbVar5->_M_string_length) ||
             ((__n != 0 &&
              (iVar3 = bcmp((pbVar6->_M_dataplus)._M_p,(pbVar5->_M_dataplus)._M_p,__n), iVar3 != 0))
             )) && (iVar3 = std::__cxx11::string::compare((char *)pbVar6), iVar3 != 0)) &&
           (((sVar2 = pbVar6->_M_string_length, sVar2 == 0 ||
             ((pbVar6->_M_dataplus)._M_p[sVar2 - 1] != '*')) ||
            (iVar3 = std::__cxx11::string::compare((ulong)pbVar6,0,(string *)(sVar2 - 1)),
            iVar3 != 0)))) goto LAB_0013354b;
        pbVar6 = pbVar6 + 1;
      }
    }
    else {
LAB_0013354b:
      bVar4 = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
  }
  return bVar4;
}

Assistant:

inline bool SSLClient::check_host_name(const char* pattern,
        size_t pattern_len) const {
        if (host_.size() == pattern_len && host_ == pattern) { return true; }

        // Wildcard match
        // https://bugs.launchpad.net/ubuntu/+source/firefox-3.0/+bug/376484
        std::vector<std::string> pattern_components;
        detail::split(&pattern[0], &pattern[pattern_len], '.',
            [&](const char* b, const char* e) {
            pattern_components.emplace_back(std::string(b, e));
        });

        if (host_components_.size() != pattern_components.size()) { return false; }

        auto itr = pattern_components.begin();
        for (const auto& h : host_components_) {
            auto& p = *itr;
            if (p != h && p != "*") {
                auto partial_match = (p.size() > 0 && p[p.size() - 1] == '*' &&
                    !p.compare(0, p.size() - 1, h));
                if (!partial_match) { return false; }
            }
            ++itr;
        }

        return true;
    }